

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathMatrix3.cpp
# Opt level: O2

Real __thiscall COLLADABU::Math::Matrix3::spectralNorm(Matrix3 *this)

{
  long lVar1;
  double *pdVar2;
  Real *pRVar3;
  Real *pRVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  Real RVar8;
  double dVar9;
  Matrix3 kP;
  Real afCoeff [3];
  double local_60 [9];
  double local_18;
  double local_10;
  double local_8;
  
  dVar9 = 0.0;
  pRVar3 = (Real *)this;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    pRVar4 = (Real *)this;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      dVar7 = 0.0;
      for (lVar6 = 0; lVar6 != 0x48; lVar6 = lVar6 + 0x18) {
        dVar7 = dVar7 + *(double *)((long)pRVar3 + lVar6) * *(double *)((long)pRVar4 + lVar6);
      }
      local_60[lVar1 * 3 + lVar5] = dVar7;
      if (dVar7 <= dVar9) {
        dVar7 = dVar9;
      }
      pRVar4 = pRVar4 + 1;
      dVar9 = dVar7;
    }
    pRVar3 = pRVar3 + 1;
  }
  pdVar2 = local_60;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      pdVar2[lVar5] = pdVar2[lVar5] * (1.0 / dVar9);
    }
    pdVar2 = pdVar2 + 3;
  }
  local_18 = -((local_60[7] * local_60[3] - local_60[4] * local_60[6]) * local_60[2] +
              (local_60[4] * local_60[8] - local_60[5] * local_60[7]) * local_60[0] +
              (local_60[5] * local_60[6] - local_60[8] * local_60[3]) * local_60[1]);
  local_10 = (((local_60[0] * local_60[8] + (local_60[0] * local_60[4] - local_60[3] * local_60[1]))
              - local_60[2] * local_60[6]) + local_60[4] * local_60[8]) - local_60[5] * local_60[7];
  local_8 = -(local_60[0] + local_60[4] + local_60[8]);
  RVar8 = maxCubicRoot(&local_18);
  dVar9 = dVar9 * RVar8;
  if (0.0 <= dVar9) {
    return SQRT(dVar9);
  }
  dVar9 = sqrt(dVar9);
  return dVar9;
}

Assistant:

Real Matrix3::spectralNorm () const
        {
            Matrix3 kP;
            size_t iRow, iCol;
            Real fPmax = 0.0;

            for ( iRow = 0; iRow < 3; iRow++ )
            {
                for ( iCol = 0; iCol < 3; iCol++ )
                {
                    kP[ iRow ][ iCol ] = 0.0;

                    for ( int iMid = 0; iMid < 3; iMid++ )
                    {
                        kP[ iRow ][ iCol ] +=
                            m[ iMid ][ iRow ] * m[ iMid ][ iCol ];
                    }

                    if ( kP[ iRow ][ iCol ] > fPmax )
                        fPmax = kP[ iRow ][ iCol ];
                }
            }

            Real fInvPmax = 1.0 / fPmax;

            for ( iRow = 0; iRow < 3; iRow++ )
            {
                for ( iCol = 0; iCol < 3; iCol++ )
                    kP[ iRow ][ iCol ] *= fInvPmax;
            }

            Real afCoeff[ 3 ];
            afCoeff[ 0 ] = -( kP[ 0 ][ 0 ] * ( kP[ 1 ][ 1 ] * kP[ 2 ][ 2 ] - kP[ 1 ][ 2 ] * kP[ 2 ][ 1 ] ) +
                              kP[ 0 ][ 1 ] * ( kP[ 2 ][ 0 ] * kP[ 1 ][ 2 ] - kP[ 1 ][ 0 ] * kP[ 2 ][ 2 ] ) +
                              kP[ 0 ][ 2 ] * ( kP[ 1 ][ 0 ] * kP[ 2 ][ 1 ] - kP[ 2 ][ 0 ] * kP[ 1 ][ 1 ] ) );
            afCoeff[ 1 ] = kP[ 0 ][ 0 ] * kP[ 1 ][ 1 ] - kP[ 0 ][ 1 ] * kP[ 1 ][ 0 ] +
                           kP[ 0 ][ 0 ] * kP[ 2 ][ 2 ] - kP[ 0 ][ 2 ] * kP[ 2 ][ 0 ] +
                           kP[ 1 ][ 1 ] * kP[ 2 ][ 2 ] - kP[ 1 ][ 2 ] * kP[ 2 ][ 1 ];
            afCoeff[ 2 ] = -( kP[ 0 ][ 0 ] + kP[ 1 ][ 1 ] + kP[ 2 ][ 2 ] );

            Real fRoot = maxCubicRoot( afCoeff );
            Real fNorm = sqrt( fPmax * fRoot );
            return fNorm;
        }